

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ipv4_tbl.c
# Opt level: O2

zt_ipv4_node * zt_ipv4_tbl_search_node(zt_ipv4_tbl *tbl,zt_ipv4_node *node)

{
  byte bVar1;
  zt_ipv4_addr *needle;
  int iVar2;
  long lVar3;
  zt_ipv4_node *pzVar4;
  
  pzVar4 = tbl->any;
  if (pzVar4 == (zt_ipv4_node *)0x0) {
    lVar3 = 0;
    while( true ) {
      bVar1 = tbl->in[lVar3];
      if ((ulong)bVar1 == 0) break;
      needle = node->addr;
      lVar3 = lVar3 + 1;
      pzVar4 = (zt_ipv4_node *)
               (tbl->tbl[bVar1 - 1] + (tbl->sz - 1 & netmask_tbl[bVar1] & needle->addr));
      while (pzVar4 = pzVar4->next, pzVar4 != (zt_ipv4_node *)0x0) {
        iVar2 = ipv4_tbl_addr_cmp(pzVar4->addr,needle);
        if (iVar2 != 0) {
          return pzVar4;
        }
      }
    }
    pzVar4 = (zt_ipv4_node *)0x0;
  }
  return pzVar4;
}

Assistant:

zt_ipv4_node   *
zt_ipv4_tbl_search_node(zt_ipv4_tbl * tbl, zt_ipv4_node * node)
{
    int           bit_iter;
    int           i = 0;
    zt_ipv4_node *match = NULL;

    if (tbl->any) {
        return tbl->any;
    }

    while (1) {
        uint32_t addr_masked;
        uint32_t key;

        bit_iter = tbl->in[i++];

        if (!bit_iter) {
            break;
        }

        addr_masked = node->addr->addr & netmask_tbl[bit_iter];
        key = addr_masked & (tbl->sz - 1);

        match = tbl->tbl[bit_iter - 1][key];

        while (match) {
            if (ipv4_tbl_addr_cmp(match->addr, node->addr)) {
                return match;
            }

            match = match->next;
        }
    }

    return NULL;
}